

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O2

Pipeline * __thiscall
capnp::Request<capnp::AnyPointer,_capnp::AnyPointer>::sendForPipeline
          (Pipeline *__return_storage_ptr__,Request<capnp::AnyPointer,_capnp::AnyPointer> *this)

{
  RequestHook *pRVar1;
  Pipeline typelessPipeline;
  Pipeline local_38;
  
  pRVar1 = (this->hook).ptr;
  (*pRVar1->_vptr_RequestHook[2])(&local_38,pRVar1);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&this->hook);
  (__return_storage_ptr__->hook).disposer = local_38.hook.disposer;
  (__return_storage_ptr__->hook).ptr = local_38.hook.ptr;
  local_38.hook.ptr = (PipelineHook *)0x0;
  (__return_storage_ptr__->ops).ptr = local_38.ops.ptr;
  (__return_storage_ptr__->ops).size_ = local_38.ops.size_;
  (__return_storage_ptr__->ops).disposer = local_38.ops.disposer;
  local_38.ops.ptr = (PipelineOp *)0x0;
  local_38.ops.size_ = 0;
  AnyPointer::Pipeline::~Pipeline(&local_38);
  return __return_storage_ptr__;
}

Assistant:

typename Results::Pipeline Request<Params, Results>::sendForPipeline() {
  auto typelessPipeline = hook->sendForPipeline();
  hook = nullptr;  // prevent reuse
  return typename Results::Pipeline(kj::mv(typelessPipeline));
}